

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Path::resolve(Path *this,Value *root)

{
  PathArgument *arg;
  pointer key;
  
  for (key = (this->args_).
             super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
             super__Vector_impl_data._M_start;
      key != (this->args_).
             super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
             super__Vector_impl_data._M_finish; key = key + 1) {
    if (key->kind_ == kindKey) {
      root = Value::operator[](root,&key->key_);
    }
    else if (key->kind_ == kindIndex) {
      if (root->field_0x8 == '\x06') {
        Value::size(root);
      }
      root = Value::operator[](root,key->index_);
    }
  }
  return root;
}

Assistant:

const Value& Path::resolve(const Value& root) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_)) {
        // Error: unable to resolve path (array value expected at position...
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: unable to resolve path (object value expected at position...)
      }
      node = &((*node)[arg.key_]);
      if (node == &Value::null) {
        // Error: unable to resolve path (object has no member named '' at
        // position...)
      }
    }
  }
  return *node;
}